

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

bitset_container_t * bitset_container_create(void)

{
  int iVar1;
  uint64_t *puVar2;
  int support;
  size_t align_size;
  bitset_container_t *bitset;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  bitset_container_t *local_8;
  
  local_8 = (bitset_container_t *)roaring_malloc(0x103f2e);
  if (local_8 == (bitset_container_t *)0x0) {
    local_8 = (bitset_container_t *)0x0;
  }
  else {
    iVar1 = croaring_hardware_support();
    puVar2 = (uint64_t *)
             roaring_aligned_malloc
                       (CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    local_8->words = puVar2;
    if (local_8->words == (uint64_t *)0x0) {
      roaring_free((void *)0x103fac);
      local_8 = (bitset_container_t *)0x0;
    }
    else {
      bitset_container_clear((bitset_container_t *)0x103fc1);
    }
  }
  return local_8;
}

Assistant:

bitset_container_t *bitset_container_create(void) {
    bitset_container_t *bitset =
        (bitset_container_t *)roaring_malloc(sizeof(bitset_container_t));

    if (!bitset) {
        return NULL;
    }

    size_t align_size = 32;
#if CROARING_IS_X64
    int support = croaring_hardware_support();
    if (support & ROARING_SUPPORTS_AVX512) {
        // sizeof(__m512i) == 64
        align_size = 64;
    } else {
        // sizeof(__m256i) == 32
        align_size = 32;
    }
#endif
    bitset->words = (uint64_t *)roaring_aligned_malloc(
        align_size, sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    if (!bitset->words) {
        roaring_free(bitset);
        return NULL;
    }
    bitset_container_clear(bitset);
    return bitset;
}